

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffgkyn(fitsfile *fptr,int nkey,char *keyname,char *value,char *comm,int *status)

{
  int iVar1;
  int namelen;
  char card [81];
  char sbuff [81];
  int local_ec;
  char local_e8 [96];
  char local_88 [88];
  
  *keyname = '\0';
  *value = '\0';
  if (comm != (char *)0x0) {
    *comm = '\0';
  }
  iVar1 = *status;
  if (iVar1 < 1) {
    iVar1 = ffgrec(fptr,nkey,local_e8,status);
    if (iVar1 < 1) {
      ffgknm(local_e8,keyname,&local_ec,status);
      iVar1 = ffpsvc(local_e8,value,comm,status);
      if (iVar1 < 1) {
        iVar1 = fftrec(keyname,status);
        if (0 < iVar1) {
          snprintf(local_88,0x51,"Name of keyword no. %d contains illegal character(s): %s",nkey,
                   keyname);
          ffpmsg(local_88);
          if ((nkey * 0x38e38e39 + 0xe38e38cU >> 2 | nkey * 0x40000000) < 0x71c71c7) {
            ffpmsg("  (This may indicate a missing END keyword).");
          }
        }
      }
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgkyn( fitsfile *fptr,      /* I - FITS file pointer             */
            int    nkey,         /* I - number of the keyword to read */
            char   *keyname,     /* O - name of the keyword           */
            char   *value,       /* O - keyword value                 */
            char   *comm,        /* O - keyword comment               */
            int    *status)      /* IO - error status                 */
/*
  Read (get) the nkey-th keyword returning the keyword name, value and comment.
  The value is just the literal string of characters in the value field
  of the keyword.  In the case of a string valued keyword, the returned
  value includes the leading and closing quote characters.  The value may be
  up to 70 characters long, and the comment may be up to 72 characters long.
  If the keyword has no value (no equal sign in column 9) then a null value
  is returned.  If comm = NULL, then do not return the comment string.
*/
{
    char card[FLEN_CARD], sbuff[FLEN_CARD];
    int namelen;

    keyname[0] = '\0';
    value[0] = '\0';
    if (comm)
        comm[0] = '\0';

    if (*status > 0)
        return(*status);

    if (ffgrec(fptr, nkey, card, status) > 0 )  /* get the 80-byte card */
        return(*status);

    ffgknm(card, keyname, &namelen, status); /* get the keyword name */

    if (ffpsvc(card, value, comm, status) > 0)   /* parse value and comment */
        return(*status);

    if (fftrec(keyname, status) > 0)  /* test keyword name; catches no END */
    {
     snprintf(sbuff, FLEN_CARD, "Name of keyword no. %d contains illegal character(s): %s",
              nkey, keyname);
     ffpmsg(sbuff);

     if (nkey % 36 == 0)  /* test if at beginning of 36-card FITS record */
            ffpmsg("  (This may indicate a missing END keyword).");
    }
    return(*status);
}